

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O3

void __thiscall
priorityQueueTest_random_Test::~priorityQueueTest_random_Test(priorityQueueTest_random_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(priorityQueueTest, random) {
    std::random_device rand_dev;

    std::default_random_engine e(810);
    std::uniform_real_distribution<double> dis(0, 100);

    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (unsigned times = 0; times < 10; ++times) {
        for (unsigned i = 0; i != 100000; ++i) {
            double num = dis(e);
            std_pq.push(num);
            pq.push(num);
        }

        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        ASSERT_EQ(std_pq.size(), pq.size());

        while (!std_pq.empty()) {
            ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
            ASSERT_EQ(std_pq.size(), pq.size());
            std_pq.pop();
            pq.pop();
        }

        ASSERT_EQ(pq.size(), 0);
        ASSERT_EQ(std_pq.size(), 0);
    }
}